

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O3

Raster * rw::xbox_to_d3d(Raster *ras)

{
  int iVar1;
  Raster *raster;
  void *texels;
  int level;
  long lVar2;
  int32 local_34;
  
  lVar2 = (long)xbox::nativeRasterOffset;
  if (*(char *)((long)&ras->height + lVar2 + 1) == '\x01') {
    iVar1 = *(int *)((long)&ras->format + lVar2);
    if (iVar1 == 0xc) {
      local_34 = 1;
    }
    else if (iVar1 == 0xf) {
      local_34 = 5;
    }
    else {
      if (iVar1 != 0xe) goto LAB_001114ae;
      local_34 = 3;
    }
    level = 0;
    raster = Raster::create(ras->width,ras->height,ras->depth,ras->format | 0x84,0);
    iVar1 = (**(code **)(*(long *)(engine + 0x58 + (long)ras->platform * 8) + 0x38))(ras);
    d3d::allocateDXT(raster,local_34,iVar1,(uint)*(byte *)((long)&ras->height + lVar2));
    if (0 < iVar1) {
      do {
        texels = (void *)(**(code **)(*(long *)(engine + 0x58 + (long)ras->platform * 8) + 0x18))
                                   (ras,level,2);
        d3d::setTexels(raster,texels,level);
        (**(code **)(*(long *)(engine + 0x58 + (long)ras->platform * 8) + 0x20))(ras,level);
        level = level + 1;
      } while (iVar1 != level);
    }
  }
  else {
LAB_001114ae:
    raster = (Raster *)0x0;
  }
  return raster;
}

Assistant:

static rw::Raster*
xbox_to_d3d(rw::Raster *ras)
{
	using namespace rw;

	int dxt = 0;
	xbox::XboxRaster *xboxras = GETXBOXRASTEREXT(ras);
	if(xboxras->customFormat){
		switch(xboxras->format){
		case xbox::D3DFMT_DXT1: dxt = 1; break;
		case xbox::D3DFMT_DXT3: dxt = 3; break;
		case xbox::D3DFMT_DXT5: dxt = 5; break;
		}
	}
	if(dxt == 0)
		return nil;

	Raster *newras = Raster::create(ras->width, ras->height, ras->depth,
		                        ras->format | Raster::TEXTURE | Raster::DONTALLOCATE);
	int numLevels = ras->getNumLevels();
	d3d::allocateDXT(newras, dxt, numLevels, xboxras->hasAlpha);
	for(int i = 0; i < numLevels; i++){
		uint8 *srcpx = ras->lock(i, Raster::LOCKREAD);
	//	uint8 *dstpx = newras->lock(i, Raster::LOCKWRITE | Raster::LOCKNOFETCH);
		d3d::setTexels(newras, srcpx, i);
	//	flipDXT(dxt, dstpx, srcpx, ras->width, ras->height);
		ras->unlock(i);
	//	newras->unlock(i);
	}

	return newras;
}